

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestMemoryAllocator.cpp
# Opt level: O3

void __thiscall MemoryAccountant::useCacheSizes(MemoryAccountant *this,size_t *sizes,size_t length)

{
  UtestShell *pUVar1;
  TestTerminatorWithoutExceptions local_20;
  
  if (this->head_ != (MemoryAccountantAllocationNode *)0x0) {
    pUVar1 = UtestShell::getCurrent();
    local_20.super_TestTerminator._vptr_TestTerminator =
         (TestTerminator)&PTR_exitCurrentTest_0016c8c0;
    (*pUVar1->_vptr_UtestShell[0x1a])
              (pUVar1,"MemoryAccountant: Cannot set cache sizes as allocations already occured!",
               "/workspace/llm4binary/github/license_c_cmakelists/approvals[P]ApprovalTests/build_O3/CMake/cpputest/cpputest-src/src/CppUTest/TestMemoryAllocator.cpp"
               ,0x1c7);
    TestTerminatorWithoutExceptions::~TestTerminatorWithoutExceptions(&local_20);
  }
  createCacheSizeNodes(this,sizes,length);
  this->useCacheSizes_ = true;
  return;
}

Assistant:

void MemoryAccountant::useCacheSizes(size_t sizes[], size_t length)
{
    if (head_)
      FAIL("MemoryAccountant: Cannot set cache sizes as allocations already occured!");

    createCacheSizeNodes(sizes, length);
    useCacheSizes_ = true;
}